

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_add_http_header_content_length(lws *wsi,lws_filepos_t content_length,uchar **p,uchar *end)

{
  int iVar1;
  char *pcVar2;
  uchar local_48 [4];
  int n;
  char b [24];
  uchar *end_local;
  uchar **p_local;
  lws_filepos_t content_length_local;
  lws *wsi_local;
  
  b._16_8_ = end;
  iVar1 = lws_snprintf((char *)local_48,0x17,"%llu",content_length);
  iVar1 = lws_add_http_header_by_token
                    (wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,local_48,iVar1,p,(uchar *)b._16_8_);
  if (iVar1 == 0) {
    (wsi->http).tx_content_length = content_length;
    (wsi->http).tx_content_remain = content_length;
    pcVar2 = lws_wsi_tag(wsi);
    _lws_log(8,"%s: %s: tx_content_length/remain %llu\n","lws_add_http_header_content_length",pcVar2
             ,content_length);
  }
  wsi_local._4_4_ = (uint)(iVar1 != 0);
  return wsi_local._4_4_;
}

Assistant:

int
lws_add_http_header_content_length(struct lws *wsi,
				   lws_filepos_t content_length,
				   unsigned char **p, unsigned char *end)
{
	char b[24];
	int n;

	n = lws_snprintf(b, sizeof(b) - 1, "%llu", (unsigned long long)content_length);
	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH,
					 (unsigned char *)b, n, p, end))
		return 1;
	wsi->http.tx_content_length = content_length;
	wsi->http.tx_content_remain = content_length;

	lwsl_info("%s: %s: tx_content_length/remain %llu\n", __func__,
		  lws_wsi_tag(wsi), (unsigned long long)content_length);

	return 0;
}